

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optional.h
# Opt level: O3

void __thiscall
llvm::optional_detail::OptionalStorage<llvm::DWARFDebugRnglistTable,_false>::reset
          (OptionalStorage<llvm::DWARFDebugRnglistTable,_false> *this)

{
  pointer puVar1;
  
  if (this->hasVal == true) {
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>_>
    ::~_Rb_tree(&(this->field_0).value.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap.
                 _M_t);
    puVar1 = (this->field_0).value.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.Offsets.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1,(long)*(pointer *)
                                    ((long)&(this->field_0).value.
                                            super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header
                                            .Offsets.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data + 0x10) - (long)puVar1)
      ;
    }
    this->hasVal = false;
  }
  return;
}

Assistant:

void reset() noexcept {
    if (hasVal) {
      value.~T();
      hasVal = false;
    }
  }